

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical_cast.h
# Opt level: O1

Time * Fixpp::details::LexicalCast<Fixpp::Type::UTCTimestamp>::cast
                 (Time *__return_storage_ptr__,char *offset,size_t size)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  runtime_error *prVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  undefined **local_a8;
  RawStreamBuf<char> buf;
  ulong local_58;
  StreamCursor local_40;
  StreamCursor cursor;
  anon_class_8_1_50ba0494 parseFragment;
  
  local_a8 = (undefined **)__assert_fail;
  buf.super_StreamBuf<char>.super_basic_streambuf<char,_std::char_traits<char>_> =
       (basic_streambuf<char,_std::char_traits<char>_>)0x0;
  buf.super_StreamBuf<char>._1_7_ = 0;
  buf.super_StreamBuf<char>._8_8_ = 0;
  buf.super_StreamBuf<char>._16_8_ = 0;
  buf.super_StreamBuf<char>._24_8_ = 0;
  buf.super_StreamBuf<char>._32_8_ = 0;
  buf.super_StreamBuf<char>._40_8_ = 0;
  std::locale::locale((locale *)&buf.super_StreamBuf<char>.field_0x30);
  local_a8 = &PTR__streambuf_00ad9d98;
  buf.super_StreamBuf<char>._16_8_ = offset + size;
  local_40.buf = (StreamBuf<char> *)&local_a8;
  buf.super_StreamBuf<char>._0_8_ = offset;
  buf.super_StreamBuf<char>._8_8_ = offset;
  StreamCursor::advance(&local_40,0);
  cursor.buf = (StreamBuf<char> *)&local_40;
  uVar2 = cast::anon_class_8_1_50ba0494::operator()
                    ((anon_class_8_1_50ba0494 *)&cursor,4,"Could not parse year from UTCTimestamp");
  iVar3 = cast::anon_class_8_1_50ba0494::operator()
                    ((anon_class_8_1_50ba0494 *)&cursor,2,"Could not parse month from UTCTimestamp")
  ;
  iVar4 = cast::anon_class_8_1_50ba0494::operator()
                    ((anon_class_8_1_50ba0494 *)&cursor,2,"Could not parse month from UTCTimestamp")
  ;
  bVar1 = StreamCursor::advance(&local_40,1);
  if (!bVar1) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar11,"Could not parse hour from UTCTimestamp, expected \'-\' got EOF");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar5 = cast::anon_class_8_1_50ba0494::operator()
                    ((anon_class_8_1_50ba0494 *)&cursor,2,"Could not parse hours from UTCTimestamp")
  ;
  bVar1 = StreamCursor::advance(&local_40,1);
  if (bVar1) {
    iVar6 = cast::anon_class_8_1_50ba0494::operator()
                      ((anon_class_8_1_50ba0494 *)&cursor,2,
                       "Could not parse minutes from UTCTimestamp");
    bVar1 = StreamCursor::advance(&local_40,1);
    if (bVar1) {
      iVar7 = cast::anon_class_8_1_50ba0494::operator()
                        ((anon_class_8_1_50ba0494 *)&cursor,2,
                         "Could not parse seconds from UTCTimestamp");
      buf.super_StreamBuf<char>._56_8_ = 0x100000000;
      if ((*(long *)&(local_40.buf)->field_0x18 == *(long *)&(local_40.buf)->field_0x10) &&
         (lVar9 = (*(code *)(*(undefined ***)local_40.buf)[7])(), lVar9 == 0)) {
        local_58 = 0;
        uVar13 = 0;
      }
      else {
        StreamCursor::advance(&local_40,1);
        uVar8 = cast::anon_class_8_1_50ba0494::operator()
                          ((anon_class_8_1_50ba0494 *)&cursor,3,
                           "Could not parse milliseconds from UTCTimestamp");
        local_58 = (ulong)uVar8;
        uVar13 = 0x100000000;
      }
      if ((*(long *)&(local_40.buf)->field_0x18 == *(long *)&(local_40.buf)->field_0x10) &&
         (lVar9 = (*(code *)(*(undefined ***)local_40.buf)[7])(), lVar9 == 0)) {
        buf.super_StreamBuf<char>._56_8_ = 0;
        uVar10 = 0;
      }
      else {
        uVar8 = cast::anon_class_8_1_50ba0494::operator()
                          ((anon_class_8_1_50ba0494 *)&cursor,3,
                           "Could not parse microseconds from UTCTimeOnly");
        uVar10 = (ulong)uVar8;
      }
      if ((int)uVar2 < 0x7b3) {
        lVar9 = 0;
      }
      else {
        uVar12 = 0x7b2;
        iVar14 = -0x7b2;
        lVar9 = 0;
        do {
          lVar15 = 0x1e13380;
          if ((((uVar12 & 3) == 0) && (lVar15 = 0x1e28500, (int)(uVar12 / 100) * 100 + iVar14 == 0))
             && (lVar15 = 0x1e13380, (int)(uVar12 / 400) * 400 + iVar14 == 0)) {
            lVar15 = 0x1e28500;
          }
          lVar9 = lVar9 + lVar15;
          uVar8 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar8;
          iVar14 = iVar14 + -1;
        } while (uVar2 != uVar8);
      }
      if (1 < iVar3) {
        uVar8 = uVar2 * -0x3d70a3d7 + 0x51eb850;
        lVar15 = 0;
        do {
          lVar16 = (long)*(int *)((long)&mkgmtime(tm_const*)::DaysOfMonth + lVar15) * 0x15180 +
                   lVar9;
          lVar9 = lVar16 + 0x15180;
          if (lVar15 != 4) {
            lVar9 = lVar16;
          }
          if ((uVar2 & 3) != 0) {
            lVar9 = lVar16;
          }
          if (0xa3d70a < (uVar8 >> 4 | uVar2 * -0x70000000) &&
              (uVar8 >> 2 | uVar2 * 0x40000000) < 0x28f5c29) {
            lVar9 = lVar16;
          }
          lVar15 = lVar15 + 4;
        } while ((ulong)(iVar3 - 1) << 2 != lVar15);
      }
      iVar3 = iVar4 * 0x15180 + -0x15180;
      if (iVar4 == 0) {
        iVar3 = 0;
      }
      __return_storage_ptr__->m_time =
           (long)iVar7 + (long)(iVar6 * 0x3c) + (long)(iVar5 * 0xe10) + (long)iVar3 + lVar9;
      (__return_storage_ptr__->m_msec).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int> = (_Optional_payload_base<int>)(uVar13 | local_58);
      (__return_storage_ptr__->m_usec).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int> =
           (_Optional_payload_base<int>)(uVar10 | buf.super_StreamBuf<char>._56_8_);
      local_a8 = (undefined **)__assert_fail;
      std::locale::~locale((locale *)&buf.super_StreamBuf<char>.field_0x30);
      return __return_storage_ptr__;
    }
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar11,"Could not parse seconds from UTCTimestamp, expected \':\' got EOF");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (prVar11,"Could not parse minutes from UTCTimestamp, expected \':\' got EOF");
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static Type::UTCTimestamp::Time cast(const char* offset, size_t size)
            {
                RawStreamBuf<> buf(const_cast<char *>(offset), size);
                StreamCursor cursor(&buf);

                const auto parseFragment = [&](size_t size, const char* error)
                {
                    int value;
                    if (!match_int_fast_n(&value, cursor, size))
                        throw std::runtime_error(error);
                    return value;
                };

                const int year  = parseFragment(4, "Could not parse year from UTCTimestamp");
                const int month = parseFragment(2, "Could not parse month from UTCTimestamp");
                const int day   = parseFragment(2, "Could not parse month from UTCTimestamp");

                // Literal('-')
                if (!cursor.advance(1))
                    throw std::runtime_error("Could not parse hour from UTCTimestamp, expected '-' got EOF");

                const int hour = parseFragment(2, "Could not parse hours from UTCTimestamp");
                //
                // Literal(':')
                if (!cursor.advance(1))
                    throw std::runtime_error("Could not parse minutes from UTCTimestamp, expected ':' got EOF");

                const int min = parseFragment(2, "Could not parse minutes from UTCTimestamp");
                //
                // Literal(':')
                if (!cursor.advance(1))
                    throw std::runtime_error("Could not parse seconds from UTCTimestamp, expected ':' got EOF");

                const int sec = parseFragment(2, "Could not parse seconds from UTCTimestamp");

                std::optional<int> msec;
                if (!cursor.eof())
                {
                    // Literal('.')
                    cursor.advance(1);
                    msec = parseFragment(3, "Could not parse milliseconds from UTCTimestamp");
                }

                std::optional<int> usec;
                if (!cursor.eof())
                {
                    usec = parseFragment(3, "Could not parse microseconds from UTCTimeOnly");
                }

                std::tm tm{};
                // tm_year is year since 1900
                tm.tm_year = year - 1900;
                // tm_mon is 0-indexed
                tm.tm_mon = month - 1;
                tm.tm_mday = day;
                tm.tm_hour = hour;
                tm.tm_min = min;
                tm.tm_sec = sec;

                return {mkgmtime(&tm), msec, usec};
            }